

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O2

string * getLastLine_abi_cxx11_(string *__return_storage_ptr__,ifstream *in)

{
  istream *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  pos_type lastPos;
  pos_type local_38;
  
  auVar4 = std::istream::tellg();
  local_38._M_off = 0;
  local_38._M_state.__count = 0;
  local_38._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  do {
    uVar2 = auVar4._8_8_;
    uVar3 = auVar4._0_8_;
    piVar1 = std::ws<char,std::char_traits<char>>((istream *)in);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    piVar1 = ignoreline(in,&local_38);
    auVar4._8_4_ = local_38._M_state.__count;
    auVar4._12_4_ = local_38._M_state.__value;
    auVar4._0_8_ = local_38._M_off;
  } while (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0);
  std::ios::clear((int)*(undefined8 *)(*(long *)in + -0x18) + (int)in);
  std::istream::seekg(in,uVar3,uVar2);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)in,(string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string getLastLine(std::ifstream& in)
{
    std::ifstream::pos_type pos = in.tellg();

    std::ifstream::pos_type lastPos;
    while (in >> std::ws && ignoreline(in, lastPos))
        pos = lastPos;

    in.clear();
    in.seekg(pos);

    std::string line;
    std::getline(in, line);
    return line;
}